

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_52c65e::sessionFIX40Fixture::createSession
          (sessionFIX40Fixture *this,int heartBtInt,int startDay,int endDay)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *beginString;
  ulong uVar2;
  Session *this_00;
  string local_720;
  int local_6fc;
  long *local_6f8;
  long local_6f0;
  long local_6e8 [2];
  long *local_6d8;
  long local_6d0;
  long local_6c8 [2];
  ulong local_6b8;
  string local_6b0;
  sessionFIX40Fixture *local_690;
  undefined8 local_688;
  code *local_680;
  code *local_678;
  undefined1 local_670 [16];
  string local_660;
  _Alloc_hider local_640;
  size_type local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_630;
  field_metrics local_620;
  TimeRange sessionTime;
  string local_608;
  _Alloc_hider local_5e8;
  size_type local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d8;
  field_metrics local_5c8;
  SessionID sessionID;
  DataDictionaryProvider provider;
  
  if (this->object != (Session *)0x0) {
    (**(code **)(*(long *)this->object + 8))();
  }
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"FIX.4.0","");
  beginString = (string *)
                &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00320f80;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 8;
  provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &provider.m_transportDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::__cxx11::string::_M_construct<char*>
            ((string *)beginString,local_720._M_dataplus._M_p,
             local_720._M_dataplus._M_p + local_720._M_string_length);
  provider.m_applicationDictionaries._M_t._M_impl._0_8_ =
       &provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_1_ =
       0;
  provider.m_applicationDictionaries._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  provider.m_transportDictionaries._M_t._M_impl._0_8_ = &PTR__FieldBase_00325970;
  local_6d8 = local_6c8;
  local_6fc = startDay;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"TW","");
  _sessionTime = &PTR__FieldBase_00320f80;
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_608,local_6d8,local_6d0 + (long)local_6d8);
  local_5e8._M_p = (pointer)&local_5d8;
  local_5e0 = 0;
  local_5d8._M_local_buf[0] = '\0';
  local_5c8.m_length = 0;
  local_5c8.m_checksum = 0;
  _sessionTime = &PTR__FieldBase_00325010;
  local_6f8 = local_6e8;
  local_6b8 = (ulong)(uint)heartBtInt;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"ISLD","");
  local_670._0_8_ = &PTR__FieldBase_00320f80;
  local_670._8_4_ = 0x38;
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_660,local_6f8,local_6f0 + (long)local_6f8);
  local_640._M_p = (pointer)&local_630;
  local_638 = 0;
  local_630._M_local_buf[0] = '\0';
  local_620.m_length = 0;
  local_620.m_checksum = 0;
  local_670._0_8_ = &PTR__FieldBase_00325400;
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"");
  FIX::SessionID::SessionID(&sessionID,beginString,&local_608,&local_660,&local_6b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)local_670);
  if (local_6f8 != local_6e8) {
    operator_delete(local_6f8,local_6e8[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionTime);
  paVar1 = &local_720.field_2;
  if (local_6d8 != local_6c8) {
    operator_delete(local_6d8,local_6c8[0] + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != paVar1) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  FIX::TimeRange::TimeRange
            (&sessionTime,&(this->super_TestCallback).startTime,&(this->super_TestCallback).endTime,
             local_6fc,endDay);
  FIX::DataDictionaryProvider::DataDictionaryProvider(&provider);
  local_720._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"FIX40","");
  FIX::TestSettings::pathForSpec((string *)local_670,&local_720);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            (&provider,&sessionID.m_beginString,(string *)local_670);
  if ((string *)local_670._0_8_ != &local_660) {
    operator_delete((void *)local_670._0_8_,(ulong)(local_660._M_dataplus._M_p + 1));
  }
  uVar2 = local_6b8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != paVar1) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  this_00 = (Session *)operator_new(0x878);
  local_688 = 0;
  local_678 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:580:26)>
              ::_M_invoke;
  local_680 = std::
              _Function_handler<FIX::UtcTimeStamp_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/SessionTestCase.cpp:580:26)>
              ::_M_manager;
  local_690 = this;
  FIX::Session::Session
            (this_00,&local_690,&(this->super_TestCallback).super_NullApplication,&this->factory,
             &sessionID,&provider,&sessionTime,uVar2,0);
  this->object = this_00;
  if (local_680 != (code *)0x0) {
    (*local_680)(&local_690,&local_690,3);
    this_00 = this->object;
  }
  FIX::Session::setResponder(this_00,(Responder *)this);
  FIX::DataDictionary::~DataDictionary(&provider.emptyDataDictionary);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree(&provider.m_applicationDictionaries._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
               *)&provider);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_frozenString._M_dataplus._M_p != &sessionID.m_frozenString.field_2) {
    operator_delete(sessionID.m_frozenString._M_dataplus._M_p,
                    sessionID.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sessionID.m_sessionQualifier._M_dataplus._M_p != &sessionID.m_sessionQualifier.field_2) {
    operator_delete(sessionID.m_sessionQualifier._M_dataplus._M_p,
                    sessionID.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&sessionID);
  return;
}

Assistant:

virtual void createSession(int heartBtInt, int startDay = -1, int endDay = -1) {
    if (object) {
      delete object;
    }

    SessionID sessionID(BeginString("FIX.4.0"), SenderCompID("TW"), TargetCompID("ISLD"));
    TimeRange sessionTime(startTime, endTime, startDay, endDay);

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary(sessionID.getBeginString(), FIX::TestSettings::pathForSpec("FIX40"));

    object = new Session([this]() { return now; }, *this, factory, sessionID, provider, sessionTime, heartBtInt, 0);
    object->setResponder(this);
  }